

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

void Gia_RsbFindMints(Gia_RsbMan_t *p,int *pMint0,int *pMint1)

{
  Vec_Int_t *pVVar1;
  Vec_Int_t *pVVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  
  uVar5 = Abc_Random(0);
  uVar6 = p->vActive->nSize;
  uVar3 = (ulong)uVar5 % (ulong)uVar6;
  iVar7 = (int)uVar3;
  if ((-1 < iVar7) && (iVar7 < (int)uVar6)) {
    iVar7 = p->vActive->pArray[uVar3];
    lVar8 = (long)iVar7;
    if ((lVar8 < 0) || ((p->vSets[0]->nSize <= iVar7 || (p->vSets[1]->nSize <= iVar7)))) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    pVVar1 = p->vSets[0]->pArray;
    pVVar2 = p->vSets[1]->pArray;
    uVar6 = Abc_Random(0);
    uVar3 = (ulong)uVar6 % (ulong)(uint)pVVar1[lVar8].nSize;
    uVar5 = Abc_Random(0);
    uVar6 = pVVar2[lVar8].nSize;
    uVar4 = (ulong)uVar5 % (ulong)uVar6;
    iVar7 = (int)uVar3;
    if ((((-1 < iVar7) && (iVar7 < pVVar1[lVar8].nSize)) && (iVar7 = (int)uVar4, -1 < iVar7)) &&
       (iVar7 < (int)uVar6)) {
      iVar7 = pVVar2[lVar8].pArray[uVar4];
      *pMint0 = pVVar1[lVar8].pArray[uVar3];
      *pMint1 = iVar7;
      return;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_RsbFindMints( Gia_RsbMan_t * p, int * pMint0, int * pMint1 )
{
    int iSetI = Abc_Random(0) % Vec_IntSize(p->vActive);
    int iSet  = Vec_IntEntry( p->vActive, iSetI );
    Vec_Int_t * vArray0 = Vec_WecEntry(p->vSets[0], iSet);
    Vec_Int_t * vArray1 = Vec_WecEntry(p->vSets[1], iSet);
    int iMint0i = Abc_Random(0) % Vec_IntSize(vArray0);
    int iMint1i = Abc_Random(0) % Vec_IntSize(vArray1);
    int iMint0 = Vec_IntEntry( vArray0, iMint0i );
    int iMint1 = Vec_IntEntry( vArray1, iMint1i );
    *pMint0 = iMint0;
    *pMint1 = iMint1;
}